

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

void __thiscall icu_63::DateFormatSymbols::disposeZoneStrings(DateFormatSymbols *this)

{
  UnicodeString ***pppUVar1;
  UnicodeString *pUVar2;
  int iVar3;
  void *in_RSI;
  UnicodeString **ppUVar4;
  long lVar5;
  long lVar6;
  
  pppUVar1 = &this->fZoneStrings;
  ppUVar4 = this->fZoneStrings;
  if (ppUVar4 != (UnicodeString **)0x0) {
    iVar3 = this->fZoneStringsRowCount;
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        pUVar2 = (*pppUVar1)[lVar5];
        if (pUVar2 != (UnicodeString *)0x0) {
          lVar6 = *(long *)((long)&pUVar2[-1].fUnion + 0x30);
          if (lVar6 != 0) {
            lVar6 = lVar6 << 6;
            do {
              icu_63::UnicodeString::~UnicodeString
                        ((UnicodeString *)
                         ((long)&pUVar2[-1].super_Replaceable.super_UObject._vptr_UObject + lVar6));
              lVar6 = lVar6 + -0x40;
            } while (lVar6 != 0);
          }
          UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),in_RSI);
          iVar3 = this->fZoneStringsRowCount;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar3);
      ppUVar4 = *pppUVar1;
    }
    uprv_free_63(ppUVar4);
  }
  ppUVar4 = this->fLocaleZoneStrings;
  if (ppUVar4 != (UnicodeString **)0x0) {
    iVar3 = this->fZoneStringsRowCount;
    if (0 < iVar3) {
      lVar5 = 0;
      do {
        pUVar2 = this->fLocaleZoneStrings[lVar5];
        if (pUVar2 != (UnicodeString *)0x0) {
          lVar6 = *(long *)((long)&pUVar2[-1].fUnion + 0x30);
          if (lVar6 != 0) {
            lVar6 = lVar6 << 6;
            do {
              icu_63::UnicodeString::~UnicodeString
                        ((UnicodeString *)
                         ((long)&pUVar2[-1].super_Replaceable.super_UObject._vptr_UObject + lVar6));
              lVar6 = lVar6 + -0x40;
            } while (lVar6 != 0);
          }
          UMemory::operator_delete__((UMemory *)((long)&pUVar2[-1].fUnion + 0x30),in_RSI);
          iVar3 = this->fZoneStringsRowCount;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar3);
      ppUVar4 = this->fLocaleZoneStrings;
    }
    uprv_free_63(ppUVar4);
  }
  *pppUVar1 = (UnicodeString **)0x0;
  this->fLocaleZoneStrings = (UnicodeString **)0x0;
  this->fZoneStringsRowCount = 0;
  this->fZoneStringsColCount = 0;
  return;
}

Assistant:

void DateFormatSymbols::disposeZoneStrings()
{
    if (fZoneStrings) {
        for (int32_t row = 0; row < fZoneStringsRowCount; ++row) {
            delete[] fZoneStrings[row];
        }
        uprv_free(fZoneStrings);
    }
    if (fLocaleZoneStrings) {
        for (int32_t row = 0; row < fZoneStringsRowCount; ++row) {
            delete[] fLocaleZoneStrings[row];
        }
        uprv_free(fLocaleZoneStrings);
    }

    fZoneStrings = NULL;
    fLocaleZoneStrings = NULL;
    fZoneStringsRowCount = 0;
    fZoneStringsColCount = 0;
}